

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOBLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::LoadLWOBFile(LWOImporter *this)

{
  uint8_t **outFile;
  uint32_t uVar1;
  ChunkHeader CVar2;
  Logger *this_00;
  DeadlyImportError *this_01;
  uint8_t *puVar3;
  uint size;
  char *message;
  uint8_t *puVar4;
  allocator local_51;
  string local_50;
  
  outFile = &this->mFileBuffer;
  puVar4 = this->mFileBuffer;
  puVar3 = puVar4 + this->fileSize;
  do {
    if (puVar3 < puVar4 + 8) {
      return;
    }
    CVar2 = IFF::LoadChunk(outFile);
    puVar4 = *outFile + ((ulong)CVar2 >> 0x20);
    if (puVar3 < puVar4) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_50,"LWOB: Invalid chunk length",&local_51);
      DeadlyImportError::DeadlyImportError(this_01,&local_50);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = CVar2.type;
    size = CVar2.length;
    if (uVar1 == 0x53555246) {
      LoadLWOBSurface(this,size);
    }
    else if (uVar1 == 0x504f4c53) {
      if ((this->mCurLayer->mFaces).
          super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->mCurLayer->mFaces).
          super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        LoadLWOBPolygons(this,size);
      }
      else {
        this_00 = DefaultLogger::get();
        message = "LWO: POLS chunk encountered twice";
LAB_005ae8ad:
        Logger::warn(this_00,message);
      }
    }
    else if (uVar1 == 0x53524653) {
      if ((this->mTags->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (this->mTags->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        this_00 = DefaultLogger::get();
        message = "LWO: SRFS chunk encountered twice";
        goto LAB_005ae8ad;
      }
      LoadLWOTags(this,size);
    }
    else if (uVar1 == 0x504e5453) {
      if ((this->mCurLayer->mTempPoints).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this->mCurLayer->mTempPoints).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_00 = DefaultLogger::get();
        message = "LWO: PNTS chunk encountered twice";
        goto LAB_005ae8ad;
      }
      LoadLWOPoints(this,size);
    }
    *outFile = puVar4;
  } while( true );
}

Assistant:

void LWOImporter::LoadLWOBFile()
{
    LE_NCONST uint8_t* const end = mFileBuffer + fileSize;
    bool running = true;
    while (running)
    {
        if (mFileBuffer + sizeof(IFF::ChunkHeader) > end)break;
        const IFF::ChunkHeader head = IFF::LoadChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
        {
            throw DeadlyImportError("LWOB: Invalid chunk length");
            break;
        }
        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // vertex list
        case AI_LWO_PNTS:
            {
                if (!mCurLayer->mTempPoints.empty())
                    ASSIMP_LOG_WARN("LWO: PNTS chunk encountered twice");
                else LoadLWOPoints(head.length);
                break;
            }
            // face list
        case AI_LWO_POLS:
            {

                if (!mCurLayer->mFaces.empty())
                    ASSIMP_LOG_WARN("LWO: POLS chunk encountered twice");
                else LoadLWOBPolygons(head.length);
                break;
            }
            // list of tags
        case AI_LWO_SRFS:
            {
                if (!mTags->empty())
                    ASSIMP_LOG_WARN("LWO: SRFS chunk encountered twice");
                else LoadLWOTags(head.length);
                break;
            }

            // surface chunk
        case AI_LWO_SURF:
            {
                LoadLWOBSurface(head.length);
                break;
            }
        }
        mFileBuffer = next;
    }
}